

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSwitch.c
# Opt level: O3

Aig_CMan_t * Aig_CManCreate(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  Aig_CMan_t *p_00;
  Vec_Ptr_t *pVVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  
  iVar11 = p->nObjs[6] + p->nObjs[5];
  iVar1 = p->nObjs[2];
  iVar2 = p->nObjs[3];
  iVar6 = iVar11 * 4 + iVar2 * 2;
  p_00 = (Aig_CMan_t *)malloc((long)iVar6 + 0x28);
  p_00->iDiff0 = 0;
  p_00->iDiff1 = 0;
  p_00->nIns = iVar1;
  p_00->nOuts = iVar2;
  p_00->nNodes = iVar11;
  p_00->nBytes = iVar6;
  p_00->iNode = iVar1 + 1;
  p_00->iPrev = -1;
  p_00->pCur = (uchar *)(p_00 + 1);
  pVVar8 = p->vObjs;
  if (0 < pVVar8->nSize) {
    lVar10 = 0;
    do {
      pvVar3 = pVVar8->pArray[lVar10];
      if ((pvVar3 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar3 + 0x18) & 7) - 7)) {
        uVar4 = *(ulong *)((long)pvVar3 + 8);
        uVar7 = 0xfffffffe;
        uVar9 = 0xfffffffe;
        if (uVar4 != 0) {
          uVar9 = *(int *)((uVar4 & 0xfffffffffffffffe) + 0x24) * 2;
        }
        uVar5 = *(ulong *)((long)pvVar3 + 0x10);
        if (uVar5 != 0) {
          uVar7 = *(int *)((uVar5 & 0xfffffffffffffffe) + 0x24) * 2;
        }
        Aig_CManAddNode(p_00,uVar9 | (uint)uVar4 & 1,(uint)uVar5 & 1 | uVar7);
        pVVar8 = p->vObjs;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar8->nSize);
  }
  pVVar8 = p->vCos;
  if (0 < pVVar8->nSize) {
    lVar10 = 0;
    do {
      uVar4 = *(ulong *)((long)pVVar8->pArray[lVar10] + 8);
      if (uVar4 == 0) {
        uVar9 = 0xfffffffe;
      }
      else {
        uVar9 = *(int *)((uVar4 & 0xfffffffffffffffe) + 0x24) * 2;
      }
      Aig_CManAddPo(p_00,(uint)uVar4 & 1 | uVar9);
      lVar10 = lVar10 + 1;
      pVVar8 = p->vCos;
    } while (lVar10 < pVVar8->nSize);
  }
  printf("\nBytes alloc = %5d.  Bytes used = %7d.  Ave per node = %4.2f. \n",
         (double)((long)p_00->pCur - (long)(p_00 + 1)) / (double)(p_00->nOuts + p_00->nNodes),
         (ulong)(uint)p_00->nBytes);
  return p_00;
}

Assistant:

Aig_CMan_t * Aig_CManCreate( Aig_Man_t * p )
{
    Aig_CMan_t * pCMan;
    Aig_Obj_t * pObj;
    int i;
    pCMan = Aig_CManStart( Aig_ManCiNum(p), Aig_ManNodeNum(p), Aig_ManCoNum(p) );
    Aig_ManForEachNode( p, pObj, i )
        Aig_CManAddNode( pCMan, 
            (Aig_ObjFaninId0(pObj) << 1) | Aig_ObjFaninC0(pObj), 
            (Aig_ObjFaninId1(pObj) << 1) | Aig_ObjFaninC1(pObj) );
    Aig_ManForEachCo( p, pObj, i )
        Aig_CManAddPo( pCMan, 
            (Aig_ObjFaninId0(pObj) << 1) | Aig_ObjFaninC0(pObj) ); 
    printf( "\nBytes alloc = %5d.  Bytes used = %7d.  Ave per node = %4.2f. \n", 
        pCMan->nBytes, (int)(pCMan->pCur - pCMan->Data), 
        1.0 * (pCMan->pCur - pCMan->Data) / (pCMan->nNodes + pCMan->nOuts ) );
//    Aig_CManStop( pCMan );
    return pCMan;
}